

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O0

ssize_t __thiscall LASindex::write(LASindex *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined1 auVar2 [16];
  undefined4 local_24;
  long *plStack_20;
  U32 version;
  ByteStreamOut *stream_local;
  LASindex *this_local;
  
  plStack_20 = (long *)CONCAT44(in_register_00000034,__fd);
  stream_local = (ByteStreamOut *)this;
  uVar1 = (**(code **)(*plStack_20 + 8))(plStack_20,"LASX",4);
  if ((uVar1 & 1) == 0) {
    laserror<>("(LASindex): writing signature");
    this_local._7_1_ = 0;
    uVar1 = extraout_RAX;
  }
  else {
    local_24 = 0;
    auVar2 = (**(code **)(*plStack_20 + 0x18))(plStack_20,&local_24);
    if ((auVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      laserror<>("(LASindex): writing version");
      this_local._7_1_ = 0;
      uVar1 = extraout_RAX_00;
    }
    else {
      uVar1 = LASquadtree::write(this->spatial,(int)plStack_20,auVar2._8_8_,__n);
      if ((uVar1 & 1) == 0) {
        laserror<>("(LASindex): cannot write LASspatial (LASquadtree)");
        this_local._7_1_ = 0;
        uVar1 = extraout_RAX_01;
      }
      else {
        uVar1 = LASinterval::write(this->interval,(int)plStack_20,__buf_00,__n);
        if ((uVar1 & 1) == 0) {
          laserror<>("(LASindex): writing LASinterval");
          this_local._7_1_ = 0;
          uVar1 = extraout_RAX_02;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
    }
  }
  return CONCAT71((int7)(uVar1 >> 8),this_local._7_1_);
}

Assistant:

BOOL LASindex::write(ByteStreamOut* stream) const
{
  if (!stream->putBytes((const U8*)"LASX", 4))
  {
    laserror("(LASindex): writing signature");
    return FALSE;
  }
  U32 version = 0;
  if (!stream->put32bitsLE((const U8*)&version))
  {
    laserror("(LASindex): writing version");
    return FALSE;
  }
  // write spatial quadtree
  if (!spatial->write(stream))
  {
    laserror("(LASindex): cannot write LASspatial (LASquadtree)");
    return FALSE;
  }
  // write interval
  if (!interval->write(stream))
  {
    laserror("(LASindex): writing LASinterval");
    return FALSE;
  }
  return TRUE;
}